

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLCellLinOp::solutionResidual
          (MLCellLinOp *this,int amrlev,MultiFab *resid,MultiFab *x,MultiFab *b,
          MultiFab *crse_bcdata)

{
  int numcomp;
  
  numcomp = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  if (crse_bcdata != (MultiFab *)0x0) {
    updateSolBC(this,amrlev,crse_bcdata);
  }
  (*(this->super_MLLinOp)._vptr_MLLinOp[0xd])
            (this,(ulong)(uint)amrlev,0,resid,x,1,0,
             (tuple<amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>)
             (this->m_bndry_sol).
             super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
             super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>);
  if ((resid->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp !=
      (b->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp) {
    Assert_host("resid.nComp() == b.nComp()",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLCellLinOp.cpp"
                ,0x21b,(char *)0x0);
  }
  MultiFab::Xpay(resid,-1.0,b,0,0,numcomp,0);
  return;
}

Assistant:

void
MLCellLinOp::solutionResidual (int amrlev, MultiFab& resid, MultiFab& x, const MultiFab& b,
                               const MultiFab* crse_bcdata)
{
    BL_PROFILE("MLCellLinOp::solutionResidual()");
    const int ncomp = getNComp();
    if (crse_bcdata != nullptr) {
        updateSolBC(amrlev, *crse_bcdata);
    }
    const int mglev = 0;
    apply(amrlev, mglev, resid, x, BCMode::Inhomogeneous, StateMode::Solution,
          m_bndry_sol[amrlev].get());

    AMREX_ALWAYS_ASSERT(resid.nComp() == b.nComp());
    MultiFab::Xpay(resid, Real(-1.0), b, 0, 0, ncomp, 0);
}